

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

_Bool array_container_remove(array_container_t *arr,uint16_t pos)

{
  int32_t iVar1;
  uint16_t in_SI;
  int32_t *in_RDI;
  _Bool is_present;
  int32_t idx;
  
  iVar1 = binarySearch(*(uint16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (-1 < iVar1) {
    memmove((void *)(*(long *)(in_RDI + 2) + (long)iVar1 * 2),
            (void *)(*(long *)(in_RDI + 2) + (long)iVar1 * 2 + 2),
            (long)((*in_RDI - iVar1) + -1) << 1);
    *in_RDI = *in_RDI + -1;
  }
  return -1 < iVar1;
}

Assistant:

static inline bool array_container_remove(array_container_t *arr,
                                          uint16_t pos) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, pos);
    const bool is_present = idx >= 0;
    if (is_present) {
        memmove(arr->array + idx, arr->array + idx + 1,
                (arr->cardinality - idx - 1) * sizeof(uint16_t));
        arr->cardinality--;
    }

    return is_present;
}